

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixWritableFile::SyncDirIfManifest(PosixWritableFile *this)

{
  int __fd;
  char *pcVar1;
  string *context;
  long in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  int fd;
  Status *status;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  Status *in_stack_ffffffffffffff80;
  Status *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  undefined1 syncing_dir;
  undefined4 in_stack_ffffffffffffff98;
  int fd_00;
  Status local_18 [2];
  long local_8;
  
  syncing_dir = (undefined1)((ulong)in_stack_ffffffffffffff90 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = in_RDI;
  Status::Status((Status *)in_stack_ffffffffffffff78);
  fd_00 = (int)((ulong)pcVar1 >> 0x20);
  if ((*(byte *)(in_RSI + 0x10014) & 1) != 0) {
    pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (in_stack_ffffffffffffff78);
    __fd = open(pcVar1,0x80000);
    if (__fd < 0) {
      context = (string *)(in_RSI + 0x10038);
      __errno_location();
      PosixError(context,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      Status::operator=(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      Status::~Status((Status *)in_stack_ffffffffffffff78);
    }
    else {
      SyncFd(fd_00,(string *)CONCAT44(__fd,in_stack_ffffffffffffff98),(bool)syncing_dir);
      Status::operator=(local_18,in_stack_ffffffffffffff80);
      Status::~Status((Status *)in_stack_ffffffffffffff78);
      close(__fd);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (Status)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Status SyncDirIfManifest() {
    Status status;
    if (!is_manifest_) {
      return status;
    }

    int fd = ::open(dirname_.c_str(), O_RDONLY | kOpenBaseFlags);
    if (fd < 0) {
      status = PosixError(dirname_, errno);
    } else {
      status = SyncFd(fd, dirname_, true);
      ::close(fd);
    }
    return status;
  }